

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_algebra.h
# Opt level: O1

mat3 * dja::inverse(mat3 *__return_storage_ptr__,mat3 *m)

{
  float_t fVar1;
  float fVar2;
  float local_3c;
  float local_38;
  float local_34;
  float local_30;
  float local_2c;
  float local_28;
  float local_24;
  float local_20;
  float local_1c;
  
  fVar1 = determinant(m);
  if ((fVar1 == 0.0) && (!NAN(fVar1))) {
    __assert_fail("det != float_t(0)",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/dj_algebra/dj_algebra.h"
                  ,0x250,"mat3 dja::inverse(const mat3 &)");
  }
  fVar2 = 1.0 / fVar1;
  adjugate(m);
  __return_storage_ptr__->m[0].x = 0.0;
  __return_storage_ptr__->m[0].y = 0.0;
  *(undefined8 *)&__return_storage_ptr__->m[0].z = 0;
  __return_storage_ptr__->m[1].y = 0.0;
  __return_storage_ptr__->m[1].z = 0.0;
  __return_storage_ptr__->m[2].x = 0.0;
  __return_storage_ptr__->m[2].y = 0.0;
  __return_storage_ptr__->m[2].z = 0.0;
  __return_storage_ptr__->m[0].x = local_3c * fVar2;
  __return_storage_ptr__->m[0].y = local_38 * fVar2;
  __return_storage_ptr__->m[0].z = local_34 * fVar2;
  __return_storage_ptr__->m[1].x = local_30 * fVar2;
  __return_storage_ptr__->m[1].y = local_2c * fVar2;
  __return_storage_ptr__->m[1].z = local_28 * fVar2;
  __return_storage_ptr__->m[2].x = local_24 * fVar2;
  __return_storage_ptr__->m[2].y = local_20 * fVar2;
  __return_storage_ptr__->m[2].z = fVar2 * local_1c;
  return __return_storage_ptr__;
}

Assistant:

mat3 inverse(const mat3& m)
{
    float_t det = determinant(m);
    DJA_ASSERT(det != float_t(0));

    return (float_t(1) / det) * adjugate(m);
}